

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_f105d::BuildFileImpl::parseTargetsMapping(BuildFileImpl *this,MappingNode *map)

{
  BuildFileDelegate *pBVar1;
  type this_00;
  bool bVar2;
  uint uVar3;
  KeyValueNode *this_01;
  Node *pNVar4;
  ScalarNode *pSVar5;
  pointer this_02;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *this_03;
  undefined8 uVar6;
  undefined8 uVar7;
  type pTVar8;
  unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  *this_04;
  StringRef local_170;
  string local_150;
  StringRef local_130;
  Node *local_120;
  StringRef local_118;
  ScalarNode *local_108;
  Node *node;
  iterator __end3;
  iterator __begin3;
  SequenceNode *__range3;
  type target;
  SequenceNode *nodes;
  string name;
  StringRef local_a8;
  KeyValueNode *entry;
  iterator __end2;
  iterator __begin2;
  MappingNode *__range2;
  MappingNode *map_local;
  BuildFileImpl *this_local;
  
  __end2 = llvm::yaml::MappingNode::begin(map);
  entry = (KeyValueNode *)llvm::yaml::MappingNode::end(map);
  while (bVar2 = llvm::yaml::
                 basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                 operator!=(&__end2,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                     *)&entry), bVar2) {
    this_01 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator*(&__end2);
    pNVar4 = llvm::yaml::KeyValueNode::getKey(this_01);
    uVar3 = llvm::yaml::Node::getType(pNVar4);
    if (uVar3 == 1) {
      pNVar4 = llvm::yaml::KeyValueNode::getValue(this_01);
      uVar3 = llvm::yaml::Node::getType(pNVar4);
      if (uVar3 == 5) {
        pSVar5 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(this_01);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  ((string *)&nodes,this,pSVar5);
        target._M_t.
        super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
        ._M_t.
        super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
        .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl =
             (__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
              )llvm::yaml::KeyValueNode::getValue(this_01);
        llvm::make_unique<llbuild::buildsystem::Target,std::__cxx11::string&>
                  ((llvm *)&__range3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodes);
        this_00._M_t.
        super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
        ._M_t.
        super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
        .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl =
             target._M_t.
             super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
             .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl;
        __end3 = llvm::yaml::SequenceNode::begin
                           ((SequenceNode *)
                            target._M_t.
                            super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
                            .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>.
                            _M_head_impl);
        node = (Node *)llvm::yaml::SequenceNode::end
                                 ((SequenceNode *)
                                  this_00._M_t.
                                  super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
                                  .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>.
                                  _M_head_impl);
        while (bVar2 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                       operator!=(&__end3,(basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                           *)&node), bVar2) {
          local_108 = (ScalarNode *)
                      llvm::yaml::
                      basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                      operator*(&__end3);
          uVar3 = llvm::yaml::Node::getType((Node *)local_108);
          pSVar5 = local_108;
          if (uVar3 == 1) {
            this_02 = std::
                      unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                      ::operator->((unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                                    *)&__range3);
            this_03 = llbuild::buildsystem::Target::getNodes(this_02);
            (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                      (&local_150,this,local_108);
            uVar6 = std::__cxx11::string::data();
            local_130.Data = (char *)uVar6;
            uVar6 = std::__cxx11::string::length();
            local_130.Length = uVar6;
            local_120 = getOrCreateNode(this,local_130,true);
            std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            ::push_back(this_03,&local_120);
            std::__cxx11::string::~string((string *)&local_150);
          }
          else {
            strlen("invalid node type in \'targets\' map");
            error(this,&pSVar5->super_Node,local_118);
          }
          llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
          operator++(&__end3);
        }
        pBVar1 = this->delegate;
        uVar6 = std::__cxx11::string::data();
        uVar7 = std::__cxx11::string::length();
        pTVar8 = std::
                 unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                 ::operator*((unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                              *)&__range3);
        (*pBVar1->_vptr_BuildFileDelegate[9])(pBVar1,uVar6,uVar7,pTVar8);
        uVar6 = std::__cxx11::string::data();
        local_170.Data = (char *)uVar6;
        uVar6 = std::__cxx11::string::length();
        local_170.Length = uVar6;
        this_04 = llvm::
                  StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                  ::operator[](&this->targets,local_170);
        std::
        unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
        ::operator=(this_04,(unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                             *)&__range3);
        std::
        unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
        ::~unique_ptr((unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                       *)&__range3);
        std::__cxx11::string::~string((string *)&nodes);
      }
      else {
        pNVar4 = llvm::yaml::KeyValueNode::getValue(this_01);
        strlen("invalid value type in \'targets\' map");
        error(this,pNVar4,stack0xffffffffffffff48);
      }
    }
    else {
      pNVar4 = llvm::yaml::KeyValueNode::getKey(this_01);
      strlen("invalid key type in \'targets\' map");
      error(this,pNVar4,local_a8);
    }
    llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
    operator++(&__end2);
  }
  return true;
}

Assistant:

bool parseTargetsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'targets' map");
        continue;
      }
      // Every value must be a sequence.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Sequence) {
        error(entry.getValue(), "invalid value type in 'targets' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::SequenceNode* nodes = static_cast<llvm::yaml::SequenceNode*>(
          entry.getValue());

      // Create the target.
      auto target = llvm::make_unique<Target>(name);

      // Add all of the nodes.
      for (auto& node: *nodes) {
        // All items must be scalar.
        if (node.getType() != llvm::yaml::Node::NK_Scalar) {
          error(&node, "invalid node type in 'targets' map");
          continue;
        }

        target->getNodes().push_back(
            getOrCreateNode(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)),
                /*isImplicit=*/true));
      }

      // Let the delegate know we loaded a target.
      delegate.loadedTarget(name, *target);

      // Add the target to the targets map.
      targets[name] = std::move(target);
    }

    return true;
  }